

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_source_pass_to_lower_layer.c
# Opt level: O0

zip_int64_t
zip_source_pass_to_lower_layer
          (zip_source_t *src,void *data,zip_uint64_t length,zip_source_cmd_t command)

{
  zip_source_cmd_t command_local;
  zip_uint64_t length_local;
  void *data_local;
  zip_source_t *src_local;
  
  switch(command) {
  case ZIP_SOURCE_OPEN:
  case ZIP_SOURCE_CLOSE:
  case ZIP_SOURCE_FREE:
  case ZIP_SOURCE_GET_FILE_ATTRIBUTES:
  case ZIP_SOURCE_SUPPORTS_REOPEN:
    src_local = (zip_source_t *)0x0;
    break;
  case ZIP_SOURCE_READ:
  case ZIP_SOURCE_ERROR:
  case ZIP_SOURCE_SEEK:
  case ZIP_SOURCE_TELL:
  case ZIP_SOURCE_ACCEPT_EMPTY:
  case ZIP_SOURCE_GET_DOS_TIME:
    src_local = (zip_source_t *)_zip_source_call(src,data,length,command);
    break;
  case ZIP_SOURCE_STAT:
    src_local = (zip_source_t *)0x40;
    break;
  case ZIP_SOURCE_BEGIN_WRITE:
  case ZIP_SOURCE_COMMIT_WRITE:
  case ZIP_SOURCE_ROLLBACK_WRITE:
  case ZIP_SOURCE_WRITE:
  case ZIP_SOURCE_SEEK_WRITE:
  case ZIP_SOURCE_TELL_WRITE:
  case ZIP_SOURCE_REMOVE:
  case ZIP_SOURCE_BEGIN_WRITE_CLONING:
    zip_error_set(&src->error,0x1c,0);
    src_local = (zip_source_t *)0xffffffffffffffff;
    break;
  case ZIP_SOURCE_SUPPORTS:
    if (length < 8) {
      zip_error_set(&src->error,0x14,0);
      src_local = (zip_source_t *)0xffffffffffffffff;
    }
    else {
      src_local = *data;
    }
    break;
  default:
    zip_error_set(&src->error,0x1c,0);
    src_local = (zip_source_t *)0xffffffffffffffff;
  }
  return (zip_int64_t)src_local;
}

Assistant:

zip_int64_t zip_source_pass_to_lower_layer(zip_source_t *src, void *data, zip_uint64_t length, zip_source_cmd_t command) {
    switch (command) {
    case ZIP_SOURCE_OPEN:
    case ZIP_SOURCE_CLOSE:
    case ZIP_SOURCE_FREE:
    case ZIP_SOURCE_GET_FILE_ATTRIBUTES:
    case ZIP_SOURCE_SUPPORTS_REOPEN:
        return 0;

    case ZIP_SOURCE_STAT:
        return sizeof(zip_stat_t);

    case ZIP_SOURCE_ACCEPT_EMPTY:
    case ZIP_SOURCE_ERROR:
    case ZIP_SOURCE_GET_DOS_TIME:
    case ZIP_SOURCE_READ:
    case ZIP_SOURCE_SEEK:
    case ZIP_SOURCE_TELL:
        return _zip_source_call(src, data, length, command);

    case ZIP_SOURCE_BEGIN_WRITE:
    case ZIP_SOURCE_BEGIN_WRITE_CLONING:
    case ZIP_SOURCE_COMMIT_WRITE:
    case ZIP_SOURCE_REMOVE:
    case ZIP_SOURCE_ROLLBACK_WRITE:
    case ZIP_SOURCE_SEEK_WRITE:
    case ZIP_SOURCE_TELL_WRITE:
    case ZIP_SOURCE_WRITE:
        zip_error_set(&src->error, ZIP_ER_OPNOTSUPP, 0);
        return -1;

    case ZIP_SOURCE_SUPPORTS:
        if (length < sizeof(zip_int64_t)) {
            zip_error_set(&src->error, ZIP_ER_INTERNAL, 0);
            return -1;
        }
        return *(zip_int64_t *)data;

    default:
        zip_error_set(&src->error, ZIP_ER_OPNOTSUPP, 0);
        return -1;
    }
}